

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O2

bool SignalsOptInRBF(CTransaction *tx)

{
  pointer pCVar1;
  pointer pCVar2;
  CTxIn *txin;
  pointer pCVar3;
  long in_FS_OFFSET;
  
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pCVar3 = pCVar2;
    if (pCVar3 == pCVar1) break;
    pCVar2 = pCVar3 + 1;
  } while (0xfffffffd < pCVar3->nSequence);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pCVar3 != pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SignalsOptInRBF(const CTransaction &tx)
{
    for (const CTxIn &txin : tx.vin) {
        if (txin.nSequence <= MAX_BIP125_RBF_SEQUENCE) {
            return true;
        }
    }
    return false;
}